

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int tree_5_3::threadTree(Btree t)

{
  int iVar1;
  node *pnVar2;
  int iVar3;
  Btree t_00;
  Btree t_01;
  
  toThread(t,(Btree)0x0);
  t_00 = (Btree)(ulong)(uint)t->data;
  printf("%c\t");
  t_01 = t->left;
  preOrderTraverse(t_01);
  pnVar2 = t_01->left;
  inOrderTraverse((tree_5_3 *)pnVar2,t_00);
  pnVar2 = pnVar2->left;
  postOrderTraverse((tree_5_3 *)pnVar2,t_00);
  for (; pnVar2 != (node *)0x0; pnVar2 = pnVar2->left) {
    iVar1 = pnVar2->data;
    iVar3 = (int)t_00;
    if (iVar1 == iVar3) goto LAB_001026a6;
    if (iVar1 <= iVar3) {
      if (iVar3 <= iVar1) break;
      pnVar2 = (node *)&pnVar2->right;
    }
  }
  pnVar2 = (node *)0x0;
LAB_001026a6:
  return (int)pnVar2;
}

Assistant:

int threadTree(Btree t) {
        Btree pre = nullptr;
        if (t != nullptr) {
            toThread(t, pre);
            pre->left = nullptr;
            t->rtag = 1;
        }
    }